

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
 __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::extract_back
          (intrusive_list<(anonymous_namespace)::TestObject> *this)

{
  long lVar1;
  TestObject *pTVar2;
  TestObject *pTVar3;
  TestObject *in_RSI;
  TestObject *pTVar4;
  
  lVar1 = *(long *)&in_RSI->data;
  if (lVar1 != 0) {
    pTVar2 = (in_RSI->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
    if ((in_RSI->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ == pTVar2) {
      pTVar3 = (TestObject *)0x0;
      pTVar4 = in_RSI;
    }
    else {
      pTVar3 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
      pTVar4 = pTVar3;
    }
    (pTVar4->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = (TestObject *)0x0
    ;
    (in_RSI->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
    (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = (TestObject *)0x0
    ;
    (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = (TestObject *)0x0
    ;
    *(long *)&in_RSI->data = lVar1 + -1;
    this->first_ = pTVar2;
    return (__uniq_ptr_data<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>,_true,_true>
              )this;
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                ,0x1ea,
                "std::unique_ptr<T> wabt::intrusive_list<(anonymous namespace)::TestObject>::extract_back() [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

inline bool intrusive_list<T>::empty() const noexcept {
  return size_ == 0;
}